

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_elements_transaction.cpp
# Opt level: O0

void __thiscall
cfdcapi_elements_transaction_VerifyConfidentialTxSign_Test::TestBody
          (cfdcapi_elements_transaction_VerifyConfidentialTxSign_Test *this)

{
  undefined1 uVar1;
  bool bVar2;
  char *pcVar3;
  char *in_R9;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  char *str_buffer;
  AssertionResult gtest_ar_1;
  int64_t satoshi;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  int in_stack_00001144;
  char *in_stack_00001148;
  uint32_t in_stack_00001154;
  char *in_stack_00001158;
  char *in_stack_00001160;
  void *in_stack_00001168;
  char *in_stack_00001180;
  int64_t in_stack_00001188;
  char *in_stack_00001190;
  bool *in_stack_fffffffffffffe18;
  AssertionResult *in_stack_fffffffffffffe20;
  CfdErrorCode *in_stack_fffffffffffffe28;
  char *in_stack_fffffffffffffe30;
  void **in_stack_fffffffffffffe38;
  void *in_stack_fffffffffffffe58;
  AssertionResult *pAVar4;
  undefined7 in_stack_fffffffffffffeb8;
  AssertHelper local_140;
  Message local_138;
  undefined4 local_12c;
  AssertionResult local_128;
  AssertHelper local_118;
  Message local_110;
  AssertionResult local_108;
  AssertHelper local_f8;
  Message local_f0;
  undefined4 local_e4;
  AssertionResult local_e0;
  char *local_d0;
  AssertHelper local_c8;
  Message local_c0;
  undefined4 local_b4;
  AssertionResult local_b0;
  undefined8 local_a0;
  string local_98;
  AssertHelper local_78;
  Message local_70;
  undefined1 local_61;
  AssertionResult local_60;
  AssertHelper local_50;
  Message local_48 [3];
  undefined4 local_2c;
  AssertionResult local_28;
  int local_14;
  long local_10;
  
  local_10 = 0;
  local_14 = CfdCreateHandle(in_stack_fffffffffffffe38);
  local_2c = 0;
  pAVar4 = &local_28;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
             (int *)in_stack_fffffffffffffe20);
  uVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar4);
  if (!(bool)uVar1) {
    testing::Message::Message(local_48);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x353d6a);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x6d8,pcVar3);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message((Message *)0x353dcd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x353e22);
  local_61 = local_10 != 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,(type *)0x353e56);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_60);
  if (!bVar2) {
    testing::Message::Message(&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)&local_60,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x6d9,pcVar3);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    testing::Message::~Message((Message *)0x353f52);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x353fcd);
  if (local_14 == 0) {
    local_a0 = 13000000000000;
    in_stack_fffffffffffffe20 = (AssertionResult *)0xbd2cc61d000;
    in_stack_fffffffffffffe28 = (CfdErrorCode *)0x0;
    local_14 = CfdVerifyConfidentialTxSign
                         (in_stack_00001168,in_stack_00001160,in_stack_00001158,in_stack_00001154,
                          in_stack_00001148,in_stack_00001144,in_stack_00001180,in_stack_00001188,
                          in_stack_00001190);
    local_b4 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,in_stack_fffffffffffffe28
               ,(int *)in_stack_fffffffffffffe20);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_b0);
    if (!bVar2) {
      testing::Message::Message(&local_c0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3540dd);
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x6e2,pcVar3);
      testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
      testing::internal::AssertHelper::~AssertHelper(&local_c8);
      testing::Message::~Message((Message *)0x35413a);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x35418f);
  }
  local_14 = CfdGetLastErrorCode(in_stack_fffffffffffffe58);
  if (local_14 != 0) {
    local_d0 = (char *)0x0;
    local_14 = CfdGetLastErrorMessage
                         ((void *)CONCAT17(uVar1,in_stack_fffffffffffffeb8),(char **)pAVar4);
    local_e4 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,in_stack_fffffffffffffe28
               ,(int *)in_stack_fffffffffffffe20);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_e0);
    if (!bVar2) {
      testing::Message::Message(&local_f0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x35427c);
      testing::internal::AssertHelper::AssertHelper
                (&local_f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x6e9,pcVar3);
      testing::internal::AssertHelper::operator=(&local_f8,&local_f0);
      testing::internal::AssertHelper::~AssertHelper(&local_f8);
      testing::Message::~Message((Message *)0x3542d9);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x35432e);
    pAVar4 = &local_108;
    testing::internal::CmpHelperSTREQ((internal *)pAVar4,"\"\"","str_buffer","",local_d0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(pAVar4);
    if (!bVar2) {
      testing::Message::Message(&local_110);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3543c3);
      testing::internal::AssertHelper::AssertHelper
                (&local_118,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x6ea,pcVar3);
      testing::internal::AssertHelper::operator=(&local_118,&local_110);
      testing::internal::AssertHelper::~AssertHelper(&local_118);
      testing::Message::~Message((Message *)0x354420);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x354475);
    CfdFreeStringBuffer((char *)in_stack_fffffffffffffe28);
    local_d0 = (char *)0x0;
  }
  local_14 = CfdFreeHandle(in_stack_fffffffffffffe28);
  local_12c = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
             (int *)in_stack_fffffffffffffe20);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_128);
  if (!bVar2) {
    testing::Message::Message(&local_138);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x354545);
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x6f0,pcVar3);
    testing::internal::AssertHelper::operator=(&local_140,&local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    testing::Message::~Message((Message *)0x3545a2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3545f7);
  return;
}

Assistant:

TEST(cfdcapi_elements_transaction, VerifyConfidentialTxSign) {
  static const char* const kTxHex = "0200000001020f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570000000000ffffffff0f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570100008000ffffffffd8bbe31bc590cbb6a47d2e53a956ec25d8890aefd60dcfc93efd34727554890b0683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000023c346000004017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b947f6002200d8510dfcf8e2330c0795c771d1e6064daab2f274ac32a6e2708df9bfa893d17a914ef3e40882e17d6e477082fcafeb0f09dc32d377b87010bad521bafdac767421d45b71b29a349c7b2ca2a06b5d8e3b5898c91df2769ed010000000029b9270002cc645552109331726c0ffadccab21620dd7a5a33260c6ac7bd1c78b98cb1e35a1976a9146c22e209d36612e0d9d2a20b814d7d8648cc7a7788ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000000000c350000001cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000023c3460003ce4c4eac09fe317f365e45c00ffcf2e9639bc0fd792c10f72cdc173c4e5ed8791976a9149bdcb18911fa9faad6632ca43b81739082b0a19588ac0000000000000247304402200268633a57723c6612ef217c49bdf804c632a14be2967c76afec4fd5781ad4c20220131f358b2381a039c8c502959c64fbfeccf287be7dae710b4446968553aefbea012103f942716865bb9b62678d99aa34de4632249d066d99de2b5a2e542e54908450d600000000000000000000000000";
  // static const char* const kSignature = "0268633a57723c6612ef217c49bdf804c632a14be2967c76afec4fd5781ad4c2131f358b2381a039c8c502959c64fbfeccf287be7dae710b4446968553aefbea";
  // static const char* const kPubkey = "03f942716865bb9b62678d99aa34de4632249d066d99de2b5a2e542e54908450d6";
  // static const char* const kPrivkey = "cU4KjNUT7GjHm7CkjRjG46SzLrXHXoH3ekXmqa2jTCFPMkQ64sw1";
  static const char* const kTxid = "57a15002d066ce52573d674df925c9bc0f1164849420705f2cfad8a68111230f";
  static const uint32_t kVout = 0;

  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  if (ret == kCfdSuccess) {
    // Verification Success Case
    int64_t satoshi = 13000000000000;
    // const char* value_commitment = "0993c069270bf8d090ce8695b82e52fb2959a9765d987d4ffd7a767b0c5b1c4cbc";
    ret = CfdVerifyConfidentialTxSign(handle, kTxHex,
        kTxid, kVout, "ert1qav7q64dhpx9y4m62rrhpa67trmvjf2ptxfddld",
        kCfdP2wpkhAddress, NULL, satoshi, NULL);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}